

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

int qRegisterNormalizedMetaTypeImplementation<QGraphicsView::ViewportAnchor>
              (QByteArray *normalizedTypeName)

{
  bool bVar1;
  __atomic_base<int> _Var2;
  long in_FS_OFFSET;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsView::ViewportAnchor>::metaType.typeId.
               _q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsView::ViewportAnchor>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var2._M_i = QMetaType::registerHelper
                           (&QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsView::ViewportAnchor>::
                             metaType);
  }
  local_20 = QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsView::ViewportAnchor>::metaType.name;
  bVar1 = operator!=(normalizedTypeName,&local_20);
  if (bVar1) {
    QMetaType::registerNormalizedTypedef(normalizedTypeName,(QMetaType)0x83b128);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return _Var2._M_i;
  }
  __stack_chk_fail();
}

Assistant:

int qRegisterNormalizedMetaTypeImplementation(const QT_PREPEND_NAMESPACE(QByteArray) &normalizedTypeName)
{
#ifndef QT_NO_QOBJECT
    Q_ASSERT_X(normalizedTypeName == QMetaObject::normalizedType(normalizedTypeName.constData()),
               "qRegisterNormalizedMetaType",
               "qRegisterNormalizedMetaType was called with a not normalized type name, "
               "please call qRegisterMetaType instead.");
#endif

    const QMetaType metaType = QMetaType::fromType<T>();
    const int id = metaType.id();

    QtPrivate::SequentialContainerTransformationHelper<T>::registerConverter();
    QtPrivate::SequentialContainerTransformationHelper<T>::registerMutableView();
    QtPrivate::AssociativeContainerTransformationHelper<T>::registerConverter();
    QtPrivate::AssociativeContainerTransformationHelper<T>::registerMutableView();
    QtPrivate::MetaTypePairHelper<T>::registerConverter();
    QtPrivate::MetaTypeSmartPointerHelper<T>::registerConverter();
#if QT_CONFIG(future)
    QtPrivate::MetaTypeQFutureHelper<T>::registerConverter();
#endif

    if (normalizedTypeName != metaType.name())
        QMetaType::registerNormalizedTypedef(normalizedTypeName, metaType);

    return id;
}